

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O2

gdImagePtr gdImageCropThreshold(gdImagePtr im,uint color,float threshold)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  gdImagePtr pgVar4;
  int x;
  int iVar5;
  int iVar6;
  int iVar7;
  gdRect local_40;
  
  pgVar4 = (gdImagePtr)0x0;
  if (threshold <= 100.0) {
    x = im->sx;
    iVar6 = im->sy;
    bVar1 = true;
    while ((iVar7 = (int)pgVar4, bVar1 && (iVar7 < iVar6))) {
      bVar1 = true;
      for (iVar5 = 0; (bVar1 && (iVar5 < x)); iVar5 = iVar5 + 1) {
        iVar2 = gdImageGetPixel(im,iVar5,iVar7);
        iVar2 = gdColorMatch(im,color,iVar2,threshold);
        bVar1 = 0 < iVar2;
      }
      pgVar4 = (gdImagePtr)(ulong)(iVar7 + 1);
    }
    iVar5 = iVar6 + -1;
    if (iVar7 == iVar5) {
      pgVar4 = (gdImagePtr)0x0;
    }
    else {
      local_40.y = iVar7 + -1;
      bVar1 = true;
      for (; (bVar1 && (-1 < iVar5)); iVar5 = iVar5 + -1) {
        bVar1 = true;
        for (iVar2 = 0; (bVar1 && (iVar2 < x)); iVar2 = iVar2 + 1) {
          iVar3 = gdImageGetPixel(im,iVar2,iVar5);
          iVar3 = gdColorMatch(im,color,iVar3,threshold);
          bVar1 = 0 < iVar3;
        }
      }
      local_40.height = (iVar6 - iVar7) + 2;
      if (iVar5 != 0) {
        local_40.height = (iVar5 - iVar7) + 3;
      }
      iVar6 = iVar7 + local_40.height + -2;
      bVar1 = true;
      for (iVar7 = 0; (bVar1 && (iVar7 < x)); iVar7 = iVar7 + 1) {
        bVar1 = true;
        for (iVar5 = 0; (bVar1 && (iVar5 < iVar6)); iVar5 = iVar5 + 1) {
          iVar2 = gdImageGetPixel(im,iVar7,iVar5);
          iVar2 = gdColorMatch(im,color,iVar2,threshold);
          bVar1 = 0 < iVar2;
        }
      }
      local_40.x = iVar7 + -1;
      bVar1 = true;
      while ((bVar1 && (0 < x))) {
        x = x + -1;
        bVar1 = true;
        for (iVar5 = 0; (bVar1 && (iVar5 < iVar6)); iVar5 = iVar5 + 1) {
          iVar2 = gdImageGetPixel(im,x,iVar5);
          iVar2 = gdColorMatch(im,color,iVar2,threshold);
          bVar1 = 0 < iVar2;
        }
      }
      local_40.width = (x - iVar7) + 2;
      pgVar4 = gdImageCrop(im,&local_40);
    }
  }
  return pgVar4;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropThreshold(gdImagePtr im, const unsigned int color, const float threshold)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	/* Pierre: crop everything sounds bad */
	if (threshold > 100.0) {
		return NULL;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}

	/* Pierre
	 * Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x, y), threshold)) > 0;
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}